

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O2

Vector * turbulence_3d(Vector *__return_storage_ptr__,Vector *p,int octaves)

{
  int iVar1;
  bool bVar2;
  undefined4 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 local_b8 [16];
  Vector local_88;
  Vector local_68;
  Vector local_48;
  
  dVar4 = p->x;
  dVar5 = p->y;
  dVar6 = p->z;
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  Turbulence3dCalls = Turbulence3dCalls + 1;
  iVar1 = 0;
  if (0 < octaves) {
    iVar1 = octaves;
  }
  local_b8 = ZEXT816(0x3ff0000000000000);
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_48.x = dVar4;
    local_48.y = dVar5;
    local_48.z = dVar6;
    noise_3d(&local_88,&local_48);
    local_68.z = local_88.z * (double)local_b8._0_8_;
    local_68.x = (double)local_b8._0_8_ * local_88.x;
    local_68.y = (double)local_b8._0_8_ * local_88.y;
    Vector::operator+=(__return_storage_ptr__,&local_68);
    dVar4 = dVar4 + dVar4;
    dVar5 = dVar5 + dVar5;
    dVar6 = dVar6 + dVar6;
    uVar3 = local_b8._12_4_;
    local_b8._8_4_ = local_b8._8_4_;
    local_b8._0_8_ = (double)local_b8._0_8_ * 0.5;
    local_b8._12_4_ = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector turbulence_3d( const Vector&  p, int octaves )
{
   double k = 1;
   Vector r = p;
   Vector res(0);
   int   i;

   Turbulence3dCalls++;

   for( i = 0; i <   octaves; i++ )
   {
      res   += noise_3d(r) * k;
      r *= 2;
      k *= 0.5;
   }
   return res;
}